

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O0

void __thiscall MemSizeCalculator::calculateFunction(MemSizeCalculator *this,Function *function)

{
  Variable *this_00;
  bool bVar1;
  int iVar2;
  vector<Variable_*,_std::allocator<Variable_*>_> *this_01;
  reference ppVVar3;
  int variableSize;
  Variable **var;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Variable_*,_std::allocator<Variable_*>_> *__range1;
  Function *function_local;
  MemSizeCalculator *this_local;
  
  this_01 = Function::getLocalVars(function);
  __end1 = std::vector<Variable_*,_std::allocator<Variable_*>_>::begin(this_01);
  var = (Variable **)std::vector<Variable_*,_std::allocator<Variable_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Variable_*const_*,_std::vector<Variable_*,_std::allocator<Variable_*>_>_>
                                *)&var);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<Variable_*const_*,_std::vector<Variable_*,_std::allocator<Variable_*>_>_>
              ::operator*(&__end1);
    iVar2 = calculateVariable(this,*ppVVar3);
    Function::addSize(function,iVar2);
    Variable::setSize(*ppVVar3,iVar2);
    this_00 = *ppVVar3;
    iVar2 = Function::getVariableOffset(function);
    Variable::setOffset(this_00,iVar2);
    __gnu_cxx::
    __normal_iterator<Variable_*const_*,_std::vector<Variable_*,_std::allocator<Variable_*>_>_>::
    operator++(&__end1);
  }
  iVar2 = Function::getSize(function);
  Function::setOffset(function,iVar2);
  return;
}

Assistant:

void MemSizeCalculator::calculateFunction(Function *function) {
    for (auto &var : function->getLocalVars()) {
        int variableSize = calculateVariable(var);
        function->addSize(variableSize);
        var->setSize(variableSize);
        var->setOffset(function->getVariableOffset());
    }

    function->setOffset(function->getSize());
}